

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_affto(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var7;
  char returnstr [4608];
  long bitvector;
  int aftype;
  int modifier;
  int nlocation;
  int sn;
  int duration;
  char sbitvector [4608];
  char saftype [4608];
  char targ [4608];
  char location [4608];
  char skill_name [4608];
  char cname [4608];
  CHAR_DATA *victim;
  AFFECT_DATA af;
  CHAR_DATA *in_stack_ffffffffffff8138;
  CHAR_DATA *in_stack_ffffffffffff8140;
  CHAR_DATA *__s;
  CHAR_DATA *ch_00;
  CHAR_DATA *__dest;
  CHAR_DATA local_7ea8 [5];
  int in_stack_ffffffffffff9344;
  flag_type *in_stack_ffffffffffff9348;
  CHAR_DATA *in_stack_ffffffffffff9350;
  undefined2 local_6c98;
  int local_6c8c;
  char local_6c88;
  char *in_stack_ffffffffffffa540;
  CHAR_DATA *in_stack_ffffffffffffa548;
  char local_5a88 [4608];
  char local_4888 [4608];
  char local_3688 [4608];
  char local_2488;
  char local_1288;
  CHAR_DATA *local_80;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  ulong auStack_50 [2];
  int local_40;
  char *local_10;
  long local_8;
  
  local_6c8c = -2;
  local_6c98 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  sprintf((char *)local_7ea8,
          "Syntax:  affto <character> <skill name> <location> <modifier> <duration> <aftype> <bitvector>\n\rLocations:\n\r"
         );
  strcat((char *)local_7ea8,"\n\rAffect types:\n\r");
  ch_00 = local_7ea8;
  pcVar6 = flags_to_string(in_stack_ffffffffffff9350,in_stack_ffffffffffff9348,
                           in_stack_ffffffffffff9344);
  strcat((char *)ch_00,pcVar6);
  strcat((char *)local_7ea8,"\n\rBitvectors:\n\r");
  __dest = local_7ea8;
  pcVar6 = flags_to_string(in_stack_ffffffffffff9350,in_stack_ffffffffffff9348,
                           in_stack_ffffffffffff9344);
  strcat((char *)__dest,pcVar6);
  strcat((char *)local_7ea8,"\n\r");
  bVar1 = str_cmp(local_10,"");
  if (bVar1) {
    local_10 = one_argument((char *)in_stack_ffffffffffff8140,(char *)in_stack_ffffffffffff8138);
    local_10 = one_argument((char *)in_stack_ffffffffffff8140,(char *)in_stack_ffffffffffff8138);
    local_10 = one_argument((char *)in_stack_ffffffffffff8140,(char *)in_stack_ffffffffffff8138);
    local_10 = one_argument((char *)in_stack_ffffffffffff8140,(char *)in_stack_ffffffffffff8138);
    if (local_4888[0] != '\0') {
      iVar2 = atoi(local_4888);
      local_6c98 = (undefined2)iVar2;
    }
    local_4888[0] = '\0';
    local_10 = one_argument((char *)in_stack_ffffffffffff8140,(char *)in_stack_ffffffffffff8138);
    if (local_4888[0] != '\0') {
      local_6c8c = atoi(local_4888);
    }
    local_4888[0] = '\0';
    local_10 = one_argument((char *)in_stack_ffffffffffff8140,(char *)in_stack_ffffffffffff8138);
    local_10 = one_argument((char *)in_stack_ffffffffffff8140,(char *)in_stack_ffffffffffff8138);
    if (local_4888[0] != '\0') {
      atoi(local_4888);
    }
    if ((((local_1288 == '\0') || (local_2488 == '\0')) || (local_5a88[0] == '\0')) ||
       ((local_6c88 == '\0' || (local_6c8c < -1)))) {
      send_to_char((char *)__dest,ch_00);
    }
    else {
      local_80 = get_char_world(in_stack_ffffffffffffa548,in_stack_ffffffffffffa540);
      if (local_80 == (CHAR_DATA *)0x0) {
        send_to_char((char *)__dest,ch_00);
      }
      iVar2 = skill_lookup((char *)ch_00);
      if (iVar2 == -1) {
        send_to_char((char *)__dest,ch_00);
      }
      else {
        iVar3 = display_lookup((char *)ch_00,(display_type *)in_stack_ffffffffffff8140);
        if ((iVar3 == 0) && (bVar1 = str_cmp(local_3688,"none"), bVar1)) {
          send_to_char((char *)__dest,ch_00);
        }
        else {
          iVar4 = flag_lookup((char *)ch_00,(flag_type *)in_stack_ffffffffffff8140);
          if ((iVar4 == -99) && (bVar1 = str_cmp(local_5a88,"AFT_SPELL"), bVar1)) {
            send_to_char((char *)__dest,ch_00);
          }
          else {
            iVar5 = flag_lookup((char *)ch_00,(flag_type *)in_stack_ffffffffffff8140);
            if (iVar5 == -99) {
              send_to_char((char *)__dest,ch_00);
            }
            else {
              init_affect((AFFECT_DATA *)0x65e107);
              local_5e = 0;
              local_5c = (undefined2)iVar2;
              local_5a = *(undefined2 *)(local_8 + 0x138);
              local_56 = (undefined2)iVar3;
              local_54 = local_6c98;
              local_58 = (undefined2)local_6c8c;
              local_40 = iVar4;
              _Var7 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffff8140 >> 0x20),
                                         (long)in_stack_ffffffffffff8138);
              auStack_50[iVar5 / 0x20] = (long)_Var7 | auStack_50[iVar5 / 0x20];
              affect_to_char(in_stack_ffffffffffff8140,(AFFECT_DATA *)in_stack_ffffffffffff8138);
              __s = local_7ea8;
              bVar1 = is_npc(in_stack_ffffffffffff8138);
              if (bVar1) {
                pcVar6 = local_80->short_descr;
              }
              else {
                pcVar6 = local_80->name;
              }
              sprintf((char *)__s,"%s has been given the %s affect.\n\r",pcVar6,
                      skill_table[iVar2].name);
              send_to_char((char *)__dest,ch_00);
            }
          }
        }
      }
    }
  }
  else {
    send_to_char((char *)__dest,ch_00);
  }
  return;
}

Assistant:

void do_affto(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;
	CHAR_DATA *victim;
	char cname[MAX_INPUT_LENGTH], skill_name[MAX_INPUT_LENGTH], location[MAX_INPUT_LENGTH],
		targ[MAX_INPUT_LENGTH], saftype[MAX_INPUT_LENGTH], sbitvector[MAX_INPUT_LENGTH];
	int duration = -2, sn = 2, nlocation = -2, modifier = 0, aftype = -2;
	long bitvector = 0;
	char returnstr[MAX_INPUT_LENGTH];

	sprintf(returnstr, "Syntax:  affto <character> <skill name> <location> <modifier> <duration> <aftype> <bitvector>\n\rLocations:\n\r");
	strcat(returnstr, "\n\rAffect types:\n\r");
	strcat(returnstr, flags_to_string(ch, aftype_table, 15));
	strcat(returnstr, "\n\rBitvectors:\n\r");
	strcat(returnstr, flags_to_string(ch, affect_flags, 9));
	strcat(returnstr, "\n\r");

	if (!str_cmp(argument, ""))
	{
		send_to_char(returnstr, ch);
		return;
	}

	argument = one_argument(argument, cname);
	argument = one_argument(argument, skill_name);
	argument = one_argument(argument, location);
	argument = one_argument(argument, targ);

	if (targ[0] != '\0')
		modifier = atoi(targ);

	targ[0] = '\0';
	argument = one_argument(argument, targ);

	if (targ[0] != '\0')
		duration = atoi(targ);

	targ[0] = '\0';
	argument = one_argument(argument, saftype);
	argument = one_argument(argument, sbitvector);

	if (targ[0] != '\0')
		bitvector = atoi(targ);

	if (cname[0] == '\0' || skill_name[0] == '\0' || saftype[0] == '\0' || sbitvector[0] == '\0' || duration < -1)
	{
		send_to_char(returnstr, ch);
		return;
	}

	victim = get_char_world(ch, cname);

	if (!victim)
	{
		send_to_char("They aren't here.\n\r", ch);
	}

	sn = skill_lookup(skill_name);

	if (sn == -1)
	{
		send_to_char("There is no skill by that name.\n\r", ch);
		return;
	}

	nlocation = display_lookup(location, apply_locations);

	if (nlocation == 0 && str_cmp(location, "none"))
	{
		send_to_char("There is no affect location by that name.\n\r", ch);
		return;
	}

	aftype = flag_lookup(saftype, aftype_table);

	if (aftype == NO_FLAG && str_cmp(saftype, "AFT_SPELL"))
	{
		send_to_char("There is no aftype by that name.\n\r", ch);
		return;
	}

	bitvector = flag_lookup(sbitvector, affect_flags);

	if (bitvector == NO_FLAG)
	{
		send_to_char("Invalid bitvector.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = sn;
	af.aftype = aftype;
	af.level = ch->level;
	af.location = nlocation;
	af.modifier = modifier;
	af.duration = duration;
	SET_BIT(af.bitvector, bitvector);
	affect_to_char(victim, &af);

	sprintf(returnstr, "%s has been given the %s affect.\n\r", is_npc(victim) ? victim->short_descr : victim->name, skill_table[sn].name);
	send_to_char(returnstr, ch);
}